

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_CURSE_WEAPON(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  player_upkeep *ppVar4;
  int16_t iVar5;
  int16_t iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  object *obj;
  int iVar9;
  int iVar10;
  char o_name [80];
  char local_88 [88];
  
  obj = equipped_item_by_slot_name(player,"weapon");
  if (obj != (object *)0x0) {
    object_desc(local_88,0x50,obj,3,player);
    if ((obj->artifact == (artifact *)0x0) || (uVar7 = Rand_div(100), 0x31 < (int)uVar7)) {
      uVar7 = Rand_div(3);
      bVar2 = obj->number;
      iVar5 = object_weight_one(obj);
      msg("A terrible black aura blasts your %s!",local_88);
      uVar8 = Rand_div(3);
      obj->to_h = ~(ushort)uVar8;
      uVar8 = Rand_div(3);
      obj->to_d = ~(ushort)uVar8;
      iVar10 = uVar7 + 1;
      if (iVar10 != 0) {
        iVar9 = 0x14;
        do {
          uVar7 = Rand_div(z_info->curse_max - 1);
          iVar6 = m_bonus(9,(int)player->depth);
          if (curses[uVar7 + L'\x01'].poss[obj->tval] == false) {
            iVar9 = iVar9 + -1;
          }
          else {
            append_object_curse(obj,uVar7 + L'\x01',iVar6 * 10);
            iVar10 = iVar10 + -1;
          }
        } while ((iVar10 != 0) && (iVar9 != 0));
      }
      bVar3 = obj->number;
      iVar6 = object_weight_one(obj);
      ppVar4 = player->upkeep;
      ppVar4->total_weight =
           ppVar4->total_weight + ((int)iVar6 * (uint)bVar3 - (int)iVar5 * (uint)bVar2);
      uVar1._0_4_ = ppVar4->update;
      uVar1._4_4_ = ppVar4->redraw;
      ppVar4->update = (int)(uVar1 | 0x6000000000009);
      ppVar4->redraw = (int)((uVar1 | 0x6000000000009) >> 0x20);
    }
    else {
      msg("A %s tries to %s, but your %s resists the effects!","terrible black aura",
          "surround your weapon",local_88);
    }
    context->ident = true;
    return true;
  }
  return true;
}

Assistant:

bool effect_handler_CURSE_WEAPON(effect_handler_context_t *context)
{
	struct object *obj;

	char o_name[80];

	/* Curse the weapon */
	obj = equipped_item_by_slot_name(player, "weapon");

	/* Nothing to curse */
	if (!obj) return (true);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_FULL, player);

	/* Attempt a saving throw */
	if (obj->artifact && (randint0(100) < 50)) {
		msg("A %s tries to %s, but your %s resists the effects!",
				   "terrible black aura", "surround your weapon", o_name);
	} else {
		int num = randint1(3);
		int max_tries = 20;
		int old_weight = obj->number * object_weight_one(obj);

		msg("A terrible black aura blasts your %s!", o_name);

		/* Hurt it a bit */
		obj->to_h = 0 - randint1(3);
		obj->to_d = 0 - randint1(3);

		/* Curse it */
		while (num && max_tries) {
			int pick = randint1(z_info->curse_max - 1);
			int power = 10 * m_bonus(9, player->depth);
			if (!curses[pick].poss[obj->tval]) {
				max_tries--;
				continue;
			}
			append_object_curse(obj, pick, power);
			num--;
		}

		/* Account for a weight change, if any */
		player->upkeep->total_weight +=
			(obj->number * object_weight_one(obj)) - old_weight;

		/* Recalculate bonuses */
		player->upkeep->update |= (PU_BONUS);

		/* Recalculate mana */
		player->upkeep->update |= (PU_MANA);

		/* Window stuff */
		player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	}

	context->ident = true;

	/* Notice */
	return (true);
}